

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::Warning(Parser *this,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *msg_local;
  Parser *this_local;
  
  if (((this->opts).no_warnings & 1U) == 0) {
    local_18 = msg;
    msg_local = (string *)this;
    std::operator+(&local_38,"warning: ",msg);
    Message(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    this->has_warning_ = true;
  }
  return;
}

Assistant:

void Parser::Warning(const std::string &msg) {
  if (!opts.no_warnings) {
    Message("warning: " + msg);
    has_warning_ = true;  // for opts.warnings_as_errors
  }
}